

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

bool __thiscall spvtools::opt::SENode::operator==(SENode *this,SENode *other)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar4 = (**this->_vptr_SENode)();
  iVar5 = (**other->_vptr_SENode)(other);
  if ((iVar4 == iVar5) &&
     ((long)(other->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(other->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)(this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    iVar4 = (*this->_vptr_SENode[7])(this);
    lVar6 = CONCAT44(extraout_var,iVar4);
    if (lVar6 == 0) {
      ppSVar3 = (this->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        if ((long)(this->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3 == lVar6)
        goto LAB_0052a4d8;
        ppSVar1 = (other->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar6;
        ppSVar2 = ppSVar3 + lVar6;
        lVar6 = lVar6 + 1;
      } while (*ppSVar1 == *ppSVar2);
    }
    else {
      iVar4 = (*other->_vptr_SENode[7])(other);
      lVar7 = CONCAT44(extraout_var_00,iVar4);
      if (lVar7 == 0) {
        __assert_fail("other_as_recurrent",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                      ,0x204,"bool spvtools::opt::SENode::operator==(const SENode &) const");
      }
      if (((*(long *)(lVar6 + 0x30) == *(long *)(lVar7 + 0x30)) &&
          (*(long *)(lVar6 + 0x38) == *(long *)(lVar7 + 0x38))) &&
         (*(long *)(lVar6 + 0x40) == *(long *)(lVar7 + 0x40))) {
LAB_0052a4d8:
        iVar4 = (**this->_vptr_SENode)(this);
        if (iVar4 == 5) {
          iVar4 = (*this->_vptr_SENode[0xf])(this);
          iVar4 = *(int *)(CONCAT44(extraout_var_01,iVar4) + 0x2c);
          iVar5 = (*other->_vptr_SENode[0xf])(other);
          if (iVar4 != *(int *)(CONCAT44(extraout_var_02,iVar5) + 0x2c)) {
            return false;
          }
        }
        iVar4 = (*this->_vptr_SENode[5])(this);
        if (CONCAT44(extraout_var_03,iVar4) != 0) {
          iVar4 = (*this->_vptr_SENode[5])(this);
          lVar6 = *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30);
          iVar4 = (*other->_vptr_SENode[5])(other);
          if (lVar6 != *(long *)(CONCAT44(extraout_var_05,iVar4) + 0x30)) {
            return false;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SENode::operator==(const SENode& other) const {
  if (GetType() != other.GetType()) return false;

  if (other.GetChildren().size() != children_.size()) return false;

  const SERecurrentNode* this_as_recurrent = AsSERecurrentNode();

  // Check the children are the same, for SERecurrentNodes we need to check the
  // offset and coefficient manually as the child vector is sorted by ids so the
  // offset/coefficient information is lost.
  if (!this_as_recurrent) {
    for (size_t index = 0; index < children_.size(); ++index) {
      if (other.GetChildren()[index] != children_[index]) return false;
    }
  } else {
    const SERecurrentNode* other_as_recurrent = other.AsSERecurrentNode();

    // We've already checked the types are the same, this should not fail if
    // this->AsSERecurrentNode() succeeded.
    assert(other_as_recurrent);

    if (this_as_recurrent->GetCoefficient() !=
        other_as_recurrent->GetCoefficient())
      return false;

    if (this_as_recurrent->GetOffset() != other_as_recurrent->GetOffset())
      return false;

    if (this_as_recurrent->GetLoop() != other_as_recurrent->GetLoop())
      return false;
  }

  // If we're dealing with a value unknown node check both nodes were created by
  // the same instruction.
  if (GetType() == SENode::ValueUnknown) {
    if (AsSEValueUnknown()->ResultId() !=
        other.AsSEValueUnknown()->ResultId()) {
      return false;
    }
  }

  if (AsSEConstantNode()) {
    if (AsSEConstantNode()->FoldToSingleValue() !=
        other.AsSEConstantNode()->FoldToSingleValue())
      return false;
  }

  return true;
}